

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O1

Ray * pbrt::SpawnRayTo(Ray *__return_storage_ptr__,Point3fi pFrom,Normal3f nFrom,Float time,
                      Point3fi pTo,Normal3f nTo)

{
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  Point3fi PVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  bool in_CF;
  bool bVar12;
  bool in_ZF;
  bool bVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float local_c;
  undefined8 uStack_8;
  
  PVar4.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval> =
       pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>;
  auVar35._4_60_ = nTo._12_60_;
  auVar35._0_4_ = nTo.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar34._8_56_ = nTo._8_56_;
  auVar34._0_8_ = nTo.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar32._4_60_ = nFrom._12_60_;
  auVar32._0_4_ = nFrom.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar39._8_56_ = nFrom._8_56_;
  auVar39._0_8_ = nFrom.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar33 = auVar34._0_16_;
  auVar29 = vmovshdup_avx(auVar33);
  auVar30 = auVar39._0_16_;
  auVar28 = vmovshdup_avx(auVar30);
  auVar36._8_8_ = 0;
  auVar36._0_4_ = pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar36._4_4_ = pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar17 = vinsertps_avx(ZEXT416((uint)pTo.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                          ZEXT416((uint)pTo.super_Point3<pbrt::Interval>.
                                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  fVar14 = PVar4.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar16._0_4_ = fVar14 + auVar17._0_4_;
  auVar16._4_4_ =
       PVar4.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       auVar17._4_4_;
  auVar16._8_4_ = auVar17._8_4_ + 0.0;
  auVar16._12_4_ = auVar17._12_4_ + 0.0;
  auVar15 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar16 = vmulps_avx512vl(auVar16,auVar15);
  fVar11 = (pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
           pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5
  ;
  auVar17 = vaddss_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                           ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high));
  auVar37 = SUB6416(ZEXT464(0x3f000000),0);
  auVar18 = vmulss_avx512f(auVar17,auVar37);
  auVar17 = vsubss_avx512f(ZEXT416((uint)fVar11),auVar18);
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx512vl(auVar30,auVar38);
  auVar20 = vandps_avx512vl(auVar28,auVar38);
  auVar31 = auVar32._0_16_;
  auVar21 = vandps_avx512vl(auVar31,auVar38);
  auVar22 = vsubss_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                           ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low));
  auVar22 = vmulss_avx512f(auVar22,auVar37);
  auVar23 = vmulss_avx512f(auVar21,auVar22);
  auVar21 = vfmsub213ss_avx512f(auVar22,auVar21,auVar23);
  auVar22 = vmulss_avx512f(auVar17,auVar31);
  auVar24 = vfmsub213ss_avx512f(auVar17,auVar31,auVar22);
  auVar17 = vinsertps_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low),
                              ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10)
  ;
  auVar26._8_8_ = 0;
  auVar26._0_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar26._4_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar17 = vaddps_avx512vl(auVar26,auVar17);
  auVar15 = vmulps_avx512vl(auVar17,auVar15);
  auVar17 = vsubps_avx512vl(auVar16,auVar15);
  auVar25 = vmovshdup_avx512vl(auVar17);
  auVar26 = vsubss_avx512f(auVar26,ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low));
  auVar26 = vmulss_avx512f(auVar26,auVar37);
  auVar27._8_8_ = 0;
  auVar27._0_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar27._4_4_ =
       pFrom.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar27 = vmovshdup_avx512vl(auVar27);
  auVar27 = vsubss_avx512f(ZEXT416((uint)pFrom.super_Point3<pbrt::Interval>.
                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),auVar27)
  ;
  auVar27 = vmulss_avx512f(auVar27,auVar37);
  auVar20 = vfmadd213ss_avx512f(auVar27,auVar20,auVar23);
  auVar21 = vaddss_avx512f(auVar20,auVar21);
  auVar19 = vfmadd231ss_avx512f(auVar21,auVar19,auVar26);
  auVar21 = vmulss_avx512f(auVar19,auVar31);
  auVar28 = vfmadd213ss_avx512f(auVar25,auVar28,auVar22);
  auVar28 = vaddss_avx512f(auVar28,auVar24);
  auVar28 = vfmadd231ss_avx512f(auVar28,auVar30,auVar17);
  vxorps_avx512vl(auVar20,auVar20);
  auVar17 = vucomiss_avx512f(auVar28);
  auVar39 = ZEXT1664(auVar17);
  auVar19 = vbroadcastss_avx512vl(auVar19);
  auVar19 = vmulps_avx512vl(auVar19,auVar30);
  auVar22._8_4_ = 0x80000000;
  auVar22._0_8_ = 0x8000000080000000;
  auVar22._12_4_ = 0x80000000;
  auVar20 = vxorps_avx512vl(auVar21,auVar22);
  uVar2 = vcmpss_avx512f(auVar28,auVar17,1);
  bVar12 = (bool)((byte)uVar2 & 1);
  auVar17._4_12_ = auVar21._4_12_;
  auVar17._0_4_ = (uint)bVar12 * auVar20._0_4_ + (uint)!bVar12 * auVar21._0_4_;
  if (!in_CF && !in_ZF) {
    auVar19 = vxorps_avx512vl(auVar19,auVar22);
  }
  auVar28 = vaddps_avx512vl(auVar15,auVar19);
  auVar15 = vaddss_avx512f(auVar18,auVar17);
  uStack_8 = vmovlps_avx(auVar28);
  local_c = auVar15._0_4_;
  auVar28 = vmovshdup_avx512vl(auVar19);
  uVar6 = 0;
  auVar32 = ZEXT464(0xff800000);
  do {
    vucomiss_avx512f(auVar39._0_16_);
    if (uVar6 < 2) {
      bVar12 = false;
      bVar13 = uVar6 == 0;
      auVar15 = auVar19;
      if (!bVar13) {
        bVar12 = uVar6 == 0;
        bVar13 = uVar6 == 1;
        auVar15 = auVar28;
        if (!bVar13) {
          auVar15 = auVar17;
        }
      }
      auVar15 = vucomiss_avx512f(auVar15);
      auVar39 = ZEXT1664(auVar15);
      if (!bVar12 && !bVar13) {
        bVar12 = false;
        pfVar9 = (float *)&uStack_8;
        if ((uVar6 != 0) &&
           (bVar12 = uVar6 == 0, pfVar9 = (float *)((long)&uStack_8 + 4), uVar6 != 1)) {
          pfVar9 = &local_c;
        }
        fVar8 = *pfVar9;
        auVar18 = vucomiss_avx512f(ZEXT416((uint)fVar8));
        auVar32 = ZEXT1664(auVar18);
        if (bVar12) {
          uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar15,0);
          bVar12 = (bool)((byte)uVar2 & 1);
          vucomiss_avx512f(auVar15);
          fVar8 = (float)((uint)bVar12 * -0x80000000 + (uint)!bVar12 * (int)fVar8 + 1);
        }
        goto LAB_003f577e;
      }
    }
    else {
      auVar15 = vucomiss_avx512f(SUB6416(ZEXT464(0x7f800000),0));
      fVar8 = auVar15._0_4_;
LAB_003f577e:
      pfVar9 = (float *)&uStack_8;
      if ((uVar6 != 0) && (pfVar9 = (float *)((long)&uStack_8 + 4), uVar6 != 1)) {
        pfVar9 = &local_c;
      }
      *pfVar9 = fVar8;
    }
    uVar5 = uStack_8;
    fVar8 = local_c;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 3);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uStack_8;
  auVar15 = vsubps_avx512vl(auVar24,auVar16);
  auVar18 = vmovshdup_avx512vl(auVar15);
  auVar25 = ZEXT416((uint)local_c);
  auVar19 = vsubss_avx512f(auVar25,ZEXT416((uint)fVar11));
  auVar20 = vandps_avx512vl(auVar33,auVar38);
  auVar21 = vandps_avx512vl(auVar29,auVar38);
  auVar22 = auVar35._0_16_;
  auVar17 = vandps_avx(auVar38,auVar22);
  auVar28 = vmovshdup_avx(auVar36);
  fVar1 = (pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high -
          pTo.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low) * 0.5;
  auVar23 = ZEXT416((uint)(auVar17._0_4_ * fVar1));
  auVar28 = vfmadd213ss_avx512f(ZEXT416((uint)((pTo.super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
                                               auVar28._0_4_) * 0.5)),auVar21,auVar23);
  auVar17 = vfmsub213ss_fma(ZEXT416((uint)fVar1),auVar17,auVar23);
  auVar17 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar28._0_4_ + auVar17._0_4_)),auVar20,
                                ZEXT416((uint)((fVar14 - pTo.super_Point3<pbrt::Interval>.
                                                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                                                         x.low) * 0.5)));
  auVar28 = vmulss_avx512f(auVar19,auVar22);
  auVar29 = vfmadd213ss_avx512f(auVar18,auVar29,auVar28);
  auVar28 = vfmsub213ss_avx512f(auVar19,auVar22,auVar28);
  auVar29 = vaddss_avx512f(auVar29,auVar28);
  auVar29 = vfmadd231ss_avx512f(auVar29,auVar15,auVar33);
  auVar15 = ZEXT816(0) << 0x20;
  fVar14 = auVar17._0_4_;
  auVar28._0_4_ = fVar14 * nTo.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar28._4_4_ = fVar14 * nTo.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar28._8_4_ = fVar14 * nTo.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar28._12_4_ = fVar14 * nTo._12_4_;
  uVar2 = vcmpss_avx512f(auVar29,auVar15,1);
  bVar12 = (bool)((byte)uVar2 & 1);
  fVar14 = (float)((uint)bVar12 * (int)-(fVar14 * auVar35._0_4_) +
                  (uint)!bVar12 * (int)(fVar14 * auVar35._0_4_));
  if (auVar29._0_4_ < 0.0) {
    uVar3 = CONCAT44(auVar28._4_4_,auVar28._0_4_);
    auVar28._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar28._8_4_ = -auVar28._8_4_;
    auVar28._12_4_ = -auVar28._12_4_;
  }
  fVar1 = auVar28._0_4_;
  auVar29._0_4_ = auVar16._0_4_ + fVar1;
  auVar29._4_4_ = auVar16._4_4_ + auVar28._4_4_;
  auVar29._8_4_ = auVar16._8_4_ + auVar28._8_4_;
  auVar29._12_4_ = auVar16._12_4_ + auVar28._12_4_;
  pfVar9 = (float *)((long)&uStack_8 + 4);
  uStack_8 = vmovlps_avx(auVar29);
  local_c = fVar11 + fVar14;
  auVar17 = vmovshdup_avx(auVar28);
  iVar7 = 0;
  do {
    fVar11 = fVar1;
    if ((iVar7 != 0) && (fVar11 = auVar17._0_4_, iVar7 != 1)) {
      fVar11 = fVar14;
    }
    if (fVar11 <= 0.0) {
      fVar11 = fVar1;
      if ((iVar7 != 0) && (fVar11 = auVar17._0_4_, iVar7 != 1)) {
        fVar11 = fVar14;
      }
      if (fVar11 < 0.0) {
        pfVar10 = (float *)&uStack_8;
        if ((iVar7 != 0) && (pfVar10 = pfVar9, iVar7 != 1)) {
          pfVar10 = &local_c;
        }
        fVar11 = *pfVar10;
        if (auVar32._0_4_ < fVar11) {
          uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar15,0);
          bVar12 = (bool)((byte)uVar2 & 1);
          fVar11 = (float)((uint)bVar12 * -0x80000000 + (uint)!bVar12 * (int)fVar11);
          fVar11 = (float)((int)fVar11 + -1 + (uint)(fVar11 <= 0.0) * 2);
        }
        goto LAB_003f5948;
      }
    }
    else {
      pfVar10 = (float *)&uStack_8;
      if ((iVar7 != 0) && (pfVar10 = pfVar9, iVar7 != 1)) {
        pfVar10 = &local_c;
      }
      fVar11 = *pfVar10;
      if (fVar11 < INFINITY) {
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar15,0);
        fVar11 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar11);
        fVar11 = (float)((-(uint)(fVar11 < 0.0) | 1) + (int)fVar11);
      }
LAB_003f5948:
      pfVar10 = (float *)&uStack_8;
      if ((iVar7 != 0) && (pfVar10 = pfVar9, iVar7 != 1)) {
        pfVar10 = &local_c;
      }
      *pfVar10 = fVar11;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 == 3) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uStack_8;
      auVar17 = vsubps_avx512vl(auVar15,auVar24);
      auVar29 = vsubss_avx512f(ZEXT416((uint)local_c),auVar25);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar5;
      uVar2 = vmovlps_avx512f(auVar18);
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar2 >> 0x20);
      (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z = fVar8;
      uVar2 = vmovlps_avx(auVar17);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar2 >> 0x20);
      (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = auVar29._0_4_;
      __return_storage_ptr__->time = time;
      (__return_storage_ptr__->medium).
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = 0;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU inline Ray SpawnRayTo(Point3fi pFrom, Normal3f nFrom, Float time,
                                   Point3fi pTo, Normal3f nTo) {
    Point3f pf = OffsetRayOrigin(pFrom, nFrom, Point3f(pTo) - Point3f(pFrom));
    Point3f pt = OffsetRayOrigin(pTo, nTo, pf - Point3f(pTo));
    return Ray(pf, pt - pf, time);
}